

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDVertex::MarkedFaceCount(ON_SubDVertex *this)

{
  bool bVar1;
  ON_SubDFace *f;
  unsigned_short vfi;
  uint mark_count;
  ON_SubDVertex *this_local;
  
  f._4_4_ = 0;
  for (f._2_2_ = 0; f._2_2_ < this->m_face_count; f._2_2_ = f._2_2_ + 1) {
    if ((this->m_faces[f._2_2_] != (ON_SubDFace *)0x0) &&
       (bVar1 = ON_ComponentStatus::RuntimeMark
                          (&(this->m_faces[f._2_2_]->super_ON_SubDComponentBase).m_status), bVar1))
    {
      f._4_4_ = f._4_4_ + 1;
    }
  }
  return f._4_4_;
}

Assistant:

unsigned int ON_SubDVertex::MarkedFaceCount() const
{
  unsigned int mark_count = 0;
  for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
  {
    const ON_SubDFace* f = m_faces[vfi];
    if (nullptr != f && f->m_status.RuntimeMark())
      ++mark_count;
  }
  return mark_count;
}